

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_highbd_inv_txfm_add_sse4_1
               (tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  long in_RCX;
  undefined4 in_EDX;
  tran_low_t *in_RSI;
  uint8_t *in_RDI;
  int unaff_retaddr;
  undefined4 unaff_retaddr_00;
  TX_SIZE tx_size;
  undefined4 in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  int eob;
  int stride_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  eob = CONCAT13(*(undefined1 *)(in_RCX + 1),in_stack_ffffffffffffffdc);
  stride_00 = (int)((ulong)in_RCX >> 0x20);
  switch(*(undefined1 *)(in_RCX + 1)) {
  case 0:
    av1_highbd_inv_txfm_add_4x4_sse4_1
              ((tran_low_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,
               (int)((ulong)in_RSI >> 0x20),(TxfmParam *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8))
    ;
    break;
  case 1:
    av1_highbd_inv_txfm_add_8x8_sse4_1
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT44(eob,in_stack_ffffffffffffffd8));
    break;
  default:
    av1_highbd_inv_txfm2d_add_universe_sse4_1
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TX_TYPE)((ulong)in_RCX >> 0x18),(TX_SIZE)((ulong)in_RCX >> 0x10),eob,unaff_retaddr);
    break;
  case 5:
    av1_highbd_inv_txfm_add_4x8_sse4_1
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT44(eob,in_stack_ffffffffffffffd8));
    break;
  case 6:
    av1_highbd_inv_txfm_add_8x4_sse4_1
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT44(eob,in_stack_ffffffffffffffd8));
    break;
  case 0xd:
    av1_highbd_inv_txfm_add_4x16_sse4_1
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT44(eob,in_stack_ffffffffffffffd8));
    break;
  case 0xe:
    av1_highbd_inv_txfm_add_16x4_sse4_1
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),stride_00,
               (TxfmParam *)CONCAT44(eob,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void av1_highbd_inv_txfm_add_sse4_1(const tran_low_t *input, uint8_t *dest,
                                    int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_8X8:
      av1_highbd_inv_txfm_add_8x8_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X8:
      av1_highbd_inv_txfm_add_4x8_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_8X4:
      av1_highbd_inv_txfm_add_8x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X4:
      av1_highbd_inv_txfm_add_4x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_16X4:
      av1_highbd_inv_txfm_add_16x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X16:
      av1_highbd_inv_txfm_add_4x16_sse4_1(input, dest, stride, txfm_param);
      break;
    default:
      av1_highbd_inv_txfm2d_add_universe_sse4_1(
          input, dest, stride, txfm_param->tx_type, tx_size, txfm_param->eob,
          txfm_param->bd);
      break;
  }
}